

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O0

void __thiscall fat::delete_directory(fat *this,string *dir_path)

{
  char cVar1;
  short sVar2;
  int iVar3;
  boot_record *pbVar4;
  FILE *pFVar5;
  long lVar6;
  void *pvVar7;
  int __whence;
  int iVar8;
  unsigned_long uVar9;
  uint uVar10;
  size_type sVar11;
  ulong uVar12;
  ostream *this_00;
  size_t __size;
  void *pvVar13;
  undefined1 *puStack_170;
  int32_t aiStack_168 [2];
  ostream *local_160;
  ulong local_158;
  void *local_150;
  int local_144;
  ulong local_140;
  void *local_138;
  reference local_130;
  reference local_128;
  ulong local_120;
  int local_114;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  ostream *local_108;
  ostream *local_100;
  int local_f4;
  ostream *local_f0;
  fat *local_e8;
  ulong local_e0;
  unsigned_long __vla_expr1;
  int i_1;
  int k;
  unsigned_long __vla_expr0;
  short local_bc;
  undefined1 local_b9;
  int local_b8;
  int16_t i;
  short sStack_b2;
  char buffer [1];
  int j;
  int16_t ac_size;
  vector<fat::directory,_std::allocator<fat::directory>_> parent_children;
  undefined1 local_78 [4];
  int32_t parent;
  vector<fat::directory,_std::allocator<fat::directory>_> dir_children;
  int32_t directory;
  char local_31;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  string *dir_path_local;
  fat *this_local;
  
  local_31 = '/';
  puStack_170 = (undefined1 *)0x10f632;
  local_e8 = this;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = dir_path;
  explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_30,this,dir_path,&local_31);
  puStack_170 = (undefined1 *)0x10f63b;
  sVar11 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_30);
  if (sVar11 == 0) {
    puStack_170 = (undefined1 *)0x10f654;
    local_f0 = std::operator<<((ostream *)&std::cout,"CANNOT DELETE ROOT");
    puStack_170 = (undefined1 *)0x10f670;
    std::ostream::operator<<(local_f0,std::endl<char,std::char_traits<char>>);
    puStack_170 = &LAB_0010f67c;
    exit(1);
  }
  puStack_170 = (undefined1 *)0x10f69a;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&dir_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  puStack_170 = (undefined1 *)0x10f6ac;
  local_f4 = get_parent_cluster(local_e8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&dir_children.
                                             super__Vector_base<fat::directory,_std::allocator<fat::directory>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_170 = (undefined1 *)0x10f6bd;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&dir_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar8 = local_f4;
  puStack_170 = (undefined1 *)0x10f6d9;
  get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)local_78,local_e8,
                   local_f4);
  puStack_170 = (undefined1 *)0x10f6e4;
  sVar11 = std::vector<fat::directory,_std::allocator<fat::directory>_>::size
                     ((vector<fat::directory,_std::allocator<fat::directory>_> *)local_78);
  if (sVar11 != 0) {
    puStack_170 = (undefined1 *)0x10f6fd;
    local_100 = std::operator<<((ostream *)&std::cout,"PATH NOT EMPTY");
    puStack_170 = (undefined1 *)0x10f719;
    std::ostream::operator<<(local_100,std::endl<char,std::char_traits<char>>);
    puStack_170 = &LAB_0010f725;
    exit(1);
  }
  if (iVar8 < 0) {
    puStack_170 = (undefined1 *)0x10f769;
    local_108 = std::operator<<((ostream *)&std::cout,"PATH NOT FOUND");
    puStack_170 = (undefined1 *)0x10f785;
    std::ostream::operator<<(local_108,std::endl<char,std::char_traits<char>>);
    puStack_170 = (undefined1 *)0x10f791;
    exit(1);
  }
  local_110 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_30;
  puStack_170 = (undefined1 *)0x10f7a1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(local_110);
  puStack_170 = (undefined1 *)0x10f7b4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&parent_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
  puStack_170 = (undefined1 *)0x10f7c9;
  local_114 = get_parent_cluster(local_e8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&parent_children.
                                              super__Vector_base<fat::directory,_std::allocator<fat::directory>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_170 = (undefined1 *)0x10f7dd;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parent_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar3 = local_114;
  puStack_170 = (undefined1 *)0x10f7fc;
  get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)&j,local_e8,local_114)
  ;
  pbVar4 = local_e8->fs_br;
  puStack_170 = (undefined1 *)0x10f83e;
  fseek((FILE *)local_e8->fs,
        (long)(iVar3 * pbVar4->cluster_size) + 0x110 +
        (long)pbVar4->fat_copies * (long)pbVar4->usable_cluster_count * 4,0);
  sStack_b2 = 0;
  local_b8 = 0;
  while( true ) {
    local_120 = (ulong)local_b8;
    puStack_170 = (undefined1 *)0x10f86d;
    sVar11 = std::vector<fat::directory,_std::allocator<fat::directory>_>::size
                       ((vector<fat::directory,_std::allocator<fat::directory>_> *)&j);
    if (sVar11 <= local_120) break;
    puStack_170 = (undefined1 *)0x10f893;
    local_128 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at
                          ((vector<fat::directory,_std::allocator<fat::directory>_> *)&j,
                           (long)local_b8);
    if (local_128->start_cluster != iVar8) {
      puStack_170 = (undefined1 *)0x10f8c2;
      local_130 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at
                            ((vector<fat::directory,_std::allocator<fat::directory>_> *)&j,
                             (long)local_b8);
      puStack_170 = (undefined1 *)0x10f8ec;
      fwrite(local_130,0x18,1,(FILE *)local_e8->fs);
      sStack_b2 = sStack_b2 + 0x18;
    }
    local_b8 = local_b8 + 1;
  }
  puStack_170 = (undefined1 *)0x10f966;
  memset(&local_b9,0,1);
  for (local_bc = 0; (int)local_bc < (int)local_e8->fs_br->cluster_size - (int)sStack_b2;
      local_bc = local_bc + 1) {
    puStack_170 = (undefined1 *)0x10f9b4;
    fwrite(&local_b9,1,1,(FILE *)local_e8->fs);
  }
  uVar12 = (ulong)(uint)local_e8->fs_br->usable_cluster_count;
  lVar6 = -(uVar12 * 4 + 0xf & 0xfffffffffffffff0);
  pvVar13 = (void *)((long)aiStack_168 + lVar6);
  for (__vla_expr1._4_4_ = 0; __vla_expr1._4_4_ < local_e8->fs_br->usable_cluster_count;
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    *(int32_t *)((long)pvVar13 + (long)__vla_expr1._4_4_ * 4) =
         local_e8->fat_table[__vla_expr1._4_4_];
  }
  *(int32_t *)((long)pvVar13 + (long)iVar8 * 4) = local_e8->FAT_UNUSED;
  pFVar5 = (FILE *)local_e8->fs;
  local_140 = uVar12;
  local_138 = pvVar13;
  _i_1 = uVar12;
  __vla_expr0 = (unsigned_long)aiStack_168;
  *(undefined8 *)((long)aiStack_168 + lVar6 + -8) = 0x10fa93;
  fseek(pFVar5,0x110,0);
  for (__vla_expr1._0_4_ = 0; pvVar7 = local_138, (int)__vla_expr1 < local_e8->fs_br->fat_copies;
      __vla_expr1._0_4_ = (int)__vla_expr1 + 1) {
    __size = local_140 << 2;
    pFVar5 = (FILE *)local_e8->fs;
    *(undefined8 *)((long)aiStack_168 + lVar6 + -8) = 0x10fae2;
    fwrite(pvVar7,__size,1,pFVar5);
  }
  uVar10 = (uint)(ushort)local_e8->fs_br->cluster_size;
  uVar12 = (ulong)uVar10;
  pvVar13 = (void *)((long)pvVar13 - (ulong)(uVar10 + 0xf & 0xfffffff0));
  local_144 = 0;
  local_158 = uVar12;
  local_150 = pvVar13;
  local_e0 = uVar12;
  *(undefined8 *)((long)pvVar13 + -8) = 0x10fb3c;
  memset(pvVar13,0,uVar12);
  __whence = local_144;
  pFVar5 = (FILE *)local_e8->fs;
  pbVar4 = local_e8->fs_br;
  cVar1 = pbVar4->fat_copies;
  iVar3 = pbVar4->usable_cluster_count;
  sVar2 = pbVar4->cluster_size;
  *(undefined8 *)((long)pvVar13 + -8) = 0x10fb80;
  fseek(pFVar5,(long)(iVar8 * sVar2) + 0x110 + (long)cVar1 * (long)iVar3 * 4,__whence);
  pvVar7 = local_150;
  uVar12 = local_158;
  pFVar5 = (FILE *)local_e8->fs;
  *(undefined8 *)((long)pvVar13 + -8) = 0x10fba5;
  fwrite(pvVar7,uVar12,1,pFVar5);
  *(undefined8 *)((long)pvVar13 + -8) = 0x10fbba;
  this_00 = std::operator<<((ostream *)&std::cout,"OK");
  local_160 = this_00;
  *(undefined8 *)((long)pvVar13 + -8) = 0x10fbd6;
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  uVar9 = __vla_expr0;
  *(undefined8 *)(__vla_expr0 - 8) = 0x10fbee;
  std::vector<fat::directory,_std::allocator<fat::directory>_>::~vector
            ((vector<fat::directory,_std::allocator<fat::directory>_> *)&j);
  *(undefined8 *)(uVar9 - 8) = 0x10fbf7;
  std::vector<fat::directory,_std::allocator<fat::directory>_>::~vector
            ((vector<fat::directory,_std::allocator<fat::directory>_> *)local_78);
  *(undefined8 *)(uVar9 - 8) = 0x10fc00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return;
}

Assistant:

void fat::delete_directory(std::string dir_path) {
    std::vector<std::string> result = explode(dir_path, '/');
    if(result.size() == 0){
        std::cout << "CANNOT DELETE ROOT" << std::endl;
        exit(1);
    }
    int32_t directory = get_parent_cluster(result);
    std::vector<fat::directory> dir_children = get_dir_children(directory);
    if (dir_children.size() > 0) {
        std::cout << "PATH NOT EMPTY" << std::endl;
        exit(1);
    }

    if (directory < 0) {
        std::cout << "PATH NOT FOUND" << std::endl;
        exit(1);
    }

    result.pop_back();
    int32_t parent = get_parent_cluster(result);
    std::vector<fat::directory> parent_children = get_dir_children(parent);
    // ---
    // Updating the parent directory content
    // ---
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               parent * fs_br->cluster_size), SEEK_SET);
    int16_t ac_size = 0;
    for (int j = 0; j < parent_children.size(); j++) {
        if (parent_children.at(j).start_cluster != directory) {
            fwrite(&parent_children.at(j), sizeof(fat::directory), 1, fs);
            ac_size += sizeof(fat::directory);
        }
    }
    char buffer[] = {'\0'};
    for (int16_t i = 0; i < (fs_br->cluster_size - ac_size); i++) {
        fwrite(buffer, sizeof(buffer), 1, fs);
    }

    // ---
    // Updating all FAT table copies
    // ---
    int32_t new_fat[fs_br->usable_cluster_count];
    for (int k = 0; k < fs_br->usable_cluster_count; k++) {
        new_fat[k] = fat_table[k];
    }
    new_fat[directory] = FAT_UNUSED;

    fseek(fs, sizeof(boot_record), SEEK_SET);
    for (int i = 0; i < fs_br->fat_copies; i++) {
        fwrite(&new_fat, sizeof(new_fat), 1, fs);
    }

    // ---
    // Erasing directory 'content' in FAT, just to be sure
    // ---
    char cluster_empty[fs_br->cluster_size];
    memset(cluster_empty, '\0', sizeof(cluster_empty));
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               directory * fs_br->cluster_size), SEEK_SET);
    fwrite(&cluster_empty, sizeof(cluster_empty), 1, fs);

    std::cout << "OK" << std::endl;
}